

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O3

size_t uv_utf16_length_as_wtf8(uint16_t *w_source_ptr,ssize_t w_source_len)

{
  ushort uVar1;
  size_t sVar2;
  uint uVar3;
  
  sVar2 = 0;
  if (w_source_len != 0) {
    do {
      uVar1 = *w_source_ptr;
      uVar3 = (uint)uVar1;
      if (((w_source_len != 1) && ((uVar1 & 0xfc00) == 0xd800)) &&
         ((w_source_ptr[1] & 0xfc00) == 0xdc00)) {
        uVar3 = (uint)uVar1 * 0x400 + (uint)w_source_ptr[1] + 0xfca02400;
      }
      if ((w_source_len < 0) && (uVar3 == 0)) {
        return sVar2;
      }
      if (uVar3 < 0x80) {
        sVar2 = sVar2 + 1;
      }
      else if (uVar3 < 0x800) {
        sVar2 = sVar2 + 2;
      }
      else if (uVar3 < 0x10000) {
        sVar2 = sVar2 + 3;
      }
      else {
        sVar2 = sVar2 + 4;
        w_source_ptr = w_source_ptr + 1;
        w_source_len = w_source_len - (ulong)(0 < w_source_len);
      }
      w_source_ptr = w_source_ptr + 1;
      w_source_len = w_source_len - (ulong)(0 < w_source_len);
    } while (w_source_len != 0);
  }
  return sVar2;
}

Assistant:

size_t uv_utf16_length_as_wtf8(const uint16_t* w_source_ptr,
                               ssize_t w_source_len) {
  size_t target_len;
  int32_t code_point;

  target_len = 0;
  while (w_source_len) {
    code_point = uv__get_surrogate_value(w_source_ptr, w_source_len);
    /* Can be invalid UTF-8 but must be valid WTF-8. */
    assert(code_point >= 0);
    if (w_source_len < 0 && code_point == 0)
      break;
    if (code_point < 0x80)
      target_len += 1;
    else if (code_point < 0x800)
      target_len += 2;
    else if (code_point < 0x10000)
      target_len += 3;
    else {
      target_len += 4;
      w_source_ptr++;
      if (w_source_len > 0)
        w_source_len--;
    }
    w_source_ptr++;
    if (w_source_len > 0)
      w_source_len--;
  }

  return target_len;
}